

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.h
# Opt level: O0

int __thiscall
Nova::Boundary_Uniform<float,_3>::Boundary_Side
          (Boundary_Uniform<float,_3> *this,int side,Range<int,_3> *region)

{
  int *piVar1;
  int local_28;
  int axis;
  Range<int,_3> *region_local;
  int side_local;
  Boundary_Uniform<float,_3> *this_local;
  
  if (side % 2 == 0) {
    piVar1 = Vector<int,_3,_true>::operator[](&region->max_corner,side / 2);
    local_28 = *piVar1 + 1;
  }
  else {
    piVar1 = Vector<int,_3,_true>::operator[](&region->min_corner,side / 2);
    local_28 = *piVar1 + -1;
  }
  return local_28;
}

Assistant:

int Boundary_Side(const int side,const Range<int,d>& region) const
    {int axis=side/2;return (side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;}